

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOutputFile.cpp
# Opt level: O2

void __thiscall Imf_2_5::OutputFile::Data::~Data(Data *this)

{
  pointer ppLVar1;
  LineBuffer *this_00;
  size_t i;
  ulong uVar2;
  
  uVar2 = 0;
  while( true ) {
    ppLVar1 = (this->lineBuffers).
              super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->lineBuffers).
                      super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppLVar1 >> 3) <= uVar2)
    break;
    this_00 = ppLVar1[uVar2];
    if (this_00 != (LineBuffer *)0x0) {
      if (this_00->compressor != (Compressor *)0x0) {
        (*this_00->compressor->_vptr_Compressor[1])();
      }
      IlmThread_2_5::Semaphore::~Semaphore(&this_00->_sem);
      std::__cxx11::string::~string((string *)&this_00->exception);
      Array<char>::~Array(&this_00->buffer);
    }
    operator_delete(this_00,0x90);
    uVar2 = uVar2 + 1;
  }
  std::
  vector<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
  ::~vector(&this->lineBuffers);
  std::
  vector<Imf_2_5::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo>_>
  ::~vector(&this->slices);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&(this->offsetInLineBuffer).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&(this->bytesPerLine).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
            );
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&(this->lineOffsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
  ;
  std::
  _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
               *)&this->frameBuffer);
  Header::~Header(&this->header);
  return;
}

Assistant:

OutputFile::Data::~Data ()
{
    for (size_t i = 0; i < lineBuffers.size(); i++)
        delete lineBuffers[i];
}